

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

WhereNonZeroLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_wherenonzero(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x521) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x521;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    WhereNonZeroLayerParams::WhereNonZeroLayerParams(this_00.wherenonzero_);
    (this->layer_).wherenonzero_ = (WhereNonZeroLayerParams *)this_00;
  }
  return (WhereNonZeroLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::WhereNonZeroLayerParams* NeuralNetworkLayer::mutable_wherenonzero() {
  if (!has_wherenonzero()) {
    clear_layer();
    set_has_wherenonzero();
    layer_.wherenonzero_ = new ::CoreML::Specification::WhereNonZeroLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.whereNonZero)
  return layer_.wherenonzero_;
}